

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O0

void test_bhdct_update_all(planck_unit_test_t *tc)

{
  undefined4 local_9c;
  int local_98 [3];
  undefined4 local_8c;
  int local_88 [3];
  int local_7c;
  undefined1 local_78 [4];
  int i;
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  planck_unit_test_t *tc_local;
  
  bhdct_setup(tc,(ion_dictionary_handler_t *)&dict.handler,(ion_dictionary_t *)local_78,
              ion_fill_edge_cases);
  for (local_7c = 0; local_7c < 10; local_7c = local_7c + 1) {
    local_88[2] = local_7c;
    local_88[1] = -0x539;
    bhdct_update(tc,(ion_dictionary_t *)local_78,local_88 + 2,local_88 + 1,'\0',1,'\x01');
  }
  for (local_7c = 0x32; local_7c < 100; local_7c = local_7c + 2) {
    local_88[0] = local_7c;
    local_8c = 0xfffffac7;
    bhdct_update(tc,(ion_dictionary_t *)local_78,local_88,&local_8c,'\0',1,'\x01');
  }
  for (local_7c = 500; local_7c < 1000; local_7c = local_7c + 5) {
    local_98[2] = local_7c;
    local_98[1] = 0xfffffac7;
    bhdct_update(tc,(ion_dictionary_t *)local_78,local_98 + 2,local_98 + 1,'\0',1,'\x01');
  }
  for (local_7c = -100; local_7c < -0x32; local_7c = local_7c + 2) {
    local_98[0] = local_7c;
    local_9c = 0xfffffac7;
    bhdct_update(tc,(ion_dictionary_t *)local_78,local_98,&local_9c,'\0',1,'\x01');
  }
  bhdct_takedown(tc,(ion_dictionary_t *)local_78);
  return;
}

Assistant:

void
test_bhdct_update_all(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;

	bhdct_setup(tc, &handler, &dict, ion_fill_edge_cases);

	int i;

	ION_FILL_LOW_LOOP(i) {
		bhdct_update(tc, &dict, IONIZE(i, int), IONIZE(-1337, int), err_ok, 1, boolean_true);
	}
	ION_FILL_MEDIUM_LOOP(i) {
		bhdct_update(tc, &dict, IONIZE(i, int), IONIZE(-1337, int), err_ok, 1, boolean_true);
	}
	ION_FILL_HIGH_LOOP(i) {
		bhdct_update(tc, &dict, IONIZE(i, int), IONIZE(-1337, int), err_ok, 1, boolean_true);
	}
	ION_FILL_EDGE_LOOP(i) {
		bhdct_update(tc, &dict, IONIZE(i, int), IONIZE(-1337, int), err_ok, 1, boolean_true);
	}

	bhdct_takedown(tc, &dict);
}